

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedBlockMemoryAllocator.cpp
# Opt level: O1

void * __thiscall Diligent::FixedBlockMemoryAllocator::MemoryPage::Allocate(MemoryPage *this)

{
  uint uVar1;
  void *pBlockAddr;
  undefined8 *__s;
  void *pvVar2;
  char (*in_RCX) [63];
  Uint32 UVar3;
  string msg;
  string local_38;
  
  if (this->m_pOwnerAllocator == (FixedBlockMemoryAllocator *)0x0) {
    FormatString<char[26],char[29]>
              (&local_38,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_pOwnerAllocator != nullptr",(char (*) [29])in_RCX);
    in_RCX = (char (*) [63])0x67;
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"Allocate",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/src/FixedBlockMemoryAllocator.cpp"
               ,0x67);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  UVar3 = this->m_NumInitializedBlocks;
  uVar1 = this->m_pOwnerAllocator->m_NumBlocksInPage;
  if (this->m_NumFreeBlocks == 0) {
    if (UVar3 != uVar1) {
      FormatString<char[26],char[63]>
                (&local_38,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"m_NumInitializedBlocks == m_pOwnerAllocator->m_NumBlocksInPage",
                 in_RCX);
      DebugAssertionFailed
                (local_38._M_dataplus._M_p,"Allocate",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/src/FixedBlockMemoryAllocator.cpp"
                 ,0x6b);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p != &local_38.field_2) {
        operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
      }
    }
    pvVar2 = (void *)0x0;
  }
  else {
    if (UVar3 < uVar1) {
      __s = (undefined8 *)GetBlockStartAddress(this,UVar3);
      memset(__s,0xcf,this->m_pOwnerAllocator->m_BlockSize);
      UVar3 = this->m_NumInitializedBlocks + 1;
      this->m_NumInitializedBlocks = UVar3;
      if (UVar3 < this->m_pOwnerAllocator->m_NumBlocksInPage) {
        pvVar2 = GetBlockStartAddress(this,UVar3);
      }
      else {
        pvVar2 = (void *)0x0;
      }
      *__s = pvVar2;
    }
    pvVar2 = this->m_pNextFreeBlock;
    dbgVerifyAddress(this,pvVar2);
    pBlockAddr = *this->m_pNextFreeBlock;
    this->m_pNextFreeBlock = pBlockAddr;
    this->m_NumFreeBlocks = this->m_NumFreeBlocks - 1;
    if (this->m_NumFreeBlocks == 0) {
      if (pBlockAddr != (void *)0x0) {
        FormatString<char[26],char[28]>
                  (&local_38,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"m_pNextFreeBlock == nullptr",(char (*) [28])in_RCX);
        DebugAssertionFailed
                  (local_38._M_dataplus._M_p,"Allocate",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/src/FixedBlockMemoryAllocator.cpp"
                   ,0x94);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_38._M_dataplus._M_p != &local_38.field_2) {
          operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
        }
      }
    }
    else {
      dbgVerifyAddress(this,pBlockAddr);
    }
    memset(pvVar2,0xab,this->m_pOwnerAllocator->m_BlockSize);
  }
  return pvVar2;
}

Assistant:

void* FixedBlockMemoryAllocator::MemoryPage::Allocate()
{
    VERIFY_EXPR(m_pOwnerAllocator != nullptr);

    if (m_NumFreeBlocks == 0)
    {
        VERIFY_EXPR(m_NumInitializedBlocks == m_pOwnerAllocator->m_NumBlocksInPage);
        return nullptr;
    }

    // Initialize the next block
    if (m_NumInitializedBlocks < m_pOwnerAllocator->m_NumBlocksInPage)
    {
        // Link next uninitialized block to the end of the list:

        //
        //                            ___________                      ___________
        //                           |           |                    |           |
        //                           | 0xcdcdcd  |                 -->| 0xcdcdcd  |   m_NumInitializedBlocks
        //                           |-----------|                |   |-----------|
        //                           |           |                |   |           |
        //  m_NumInitializedBlocks   | 0xcdcdcd  |      ==>        ---|           |
        //                           |-----------|                    |-----------|
        //
        //                           ~           ~                    ~           ~
        //                           |           |                    |           |
        //                       0   |           |                    |           |
        //                            -----------                      -----------
        //
        auto* pUninitializedBlock = GetBlockStartAddress(m_NumInitializedBlocks);
        FillWithDebugPattern(pUninitializedBlock, InitializedBlockMemPattern, m_pOwnerAllocator->m_BlockSize);
        void** ppNextBlock = reinterpret_cast<void**>(pUninitializedBlock);
        ++m_NumInitializedBlocks;
        if (m_NumInitializedBlocks < m_pOwnerAllocator->m_NumBlocksInPage)
            *ppNextBlock = GetBlockStartAddress(m_NumInitializedBlocks);
        else
            *ppNextBlock = nullptr;
    }

    void* res = m_pNextFreeBlock;
    dbgVerifyAddress(res);
    // Move pointer to the next free block
    m_pNextFreeBlock = *reinterpret_cast<void**>(m_pNextFreeBlock);
    --m_NumFreeBlocks;
    if (m_NumFreeBlocks != 0)
        dbgVerifyAddress(m_pNextFreeBlock);
    else
        VERIFY_EXPR(m_pNextFreeBlock == nullptr);

    FillWithDebugPattern(res, AllocatedBlockMemPattern, m_pOwnerAllocator->m_BlockSize);
    return res;
}